

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_ags.cpp
# Opt level: O0

WMMAAccessChain dxil_spv::build_wmma_access_chain(Impl *impl,Value *offset,Value *stride)

{
  WMMAAccessChain WVar1;
  undefined8 uVar2;
  Id IVar3;
  Id IVar4;
  Builder *this;
  Operation *pOVar5;
  mapped_type *meta_00;
  void *pvVar6;
  Operation *this_00;
  char local_2078 [8];
  char buffer_1 [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb_1;
  Operation *chain_2;
  Operation *cast;
  Operation *chain_1;
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  Id buffer_id;
  mapped_type *meta;
  Operation *chain;
  Builder *builder;
  Value *stride_local;
  Value *offset_local;
  Impl *impl_local;
  Id IStack_10;
  WMMAAccessChain ret;
  
  memset((void *)((long)&impl_local + 4),0,0xc);
  this = Converter::Impl::builder(impl);
  if ((impl->ags).active_uav_op == AtomicBinOp) {
    IVar3 = spv::Builder::makeUintType(this,0x20);
    IVar3 = spv::Builder::makePointer(this,StorageClassWorkgroup,IVar3);
    pOVar5 = Converter::Impl::allocate(impl,OpAccessChain,IVar3);
    Operation::add_id(pOVar5,(impl->ags).active_uav_ptr);
    IVar3 = Converter::Impl::get_id_for_value(impl,offset,0);
    Operation::add_id(pOVar5,IVar3);
    Converter::Impl::add(impl,pOVar5,false);
    impl_local._4_4_ = pOVar5->id;
    IStack_10 = Converter::Impl::get_id_for_value(impl,stride,0);
  }
  else {
    meta_00 = std::
              unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
              ::operator[](&impl->handle_to_resource_meta,&(impl->ags).active_uav_ptr);
    if ((meta_00->storage == StorageClassStorageBuffer) ||
       ((impl->ags).active_uav_op == AtomicBinOp)) {
      IVar3 = get_buffer_alias_handle(impl,meta_00,(impl->ags).active_uav_ptr,Integer,B8,V1);
      if (IVar3 == 0) {
        buffer._4088_8_ = get_thread_log_callback();
        if ((LoggingCallback)buffer._4088_8_ == (LoggingCallback)0x0) {
          fprintf(_stderr,"[ERROR]: Failed to get buffer alias.\n");
          fflush(_stderr);
        }
        else {
          snprintf((char *)&chain_1,0x1000,"Failed to get buffer alias.\n");
          uVar2 = buffer._4088_8_;
          pvVar6 = get_thread_log_callback_userdata();
          (*(code *)uVar2)(pvVar6,2,&chain_1);
        }
      }
      else {
        IVar4 = spv::Builder::makeUintType(this,8);
        IVar4 = spv::Builder::makePointer(this,StorageClassStorageBuffer,IVar4);
        pOVar5 = Converter::Impl::allocate(impl,OpAccessChain,IVar4);
        Operation::add_id(pOVar5,IVar3);
        IVar3 = spv::Builder::makeUintConstant(this,0,false);
        Operation::add_id(pOVar5,IVar3);
        IVar3 = Converter::Impl::get_id_for_value(impl,offset,0);
        Operation::add_id(pOVar5,IVar3);
        Converter::Impl::add(impl,pOVar5,false);
        impl_local._4_4_ = pOVar5->id;
        IStack_10 = Converter::Impl::get_id_for_value(impl,stride,0);
      }
    }
    else if (meta_00->storage == StorageClassPhysicalStorageBuffer) {
      if ((impl->ags).u8_array_bda_type == 0) {
        IVar3 = spv::Builder::makeUintType(this,8);
        IVar3 = spv::Builder::makeRuntimeArray(this,IVar3);
        (impl->ags).u8_array_bda_type = IVar3;
        spv::Builder::addDecoration(this,(impl->ags).u8_array_bda_type,DecorationArrayStride,1);
      }
      IVar3 = spv::Builder::makePointer
                        (this,StorageClassPhysicalStorageBuffer,(impl->ags).u8_array_bda_type);
      pOVar5 = Converter::Impl::allocate(impl,OpBitcast,IVar3);
      Operation::add_id(pOVar5,(impl->ags).active_uav_ptr);
      Converter::Impl::add(impl,pOVar5,false);
      IVar3 = spv::Builder::makeUintType(this,8);
      IVar3 = spv::Builder::makePointer(this,StorageClassPhysicalStorageBuffer,IVar3);
      this_00 = Converter::Impl::allocate(impl,OpAccessChain,IVar3);
      Operation::add_id(this_00,pOVar5->id);
      IVar3 = Converter::Impl::get_id_for_value(impl,offset,0);
      Operation::add_id(this_00,IVar3);
      Converter::Impl::add(impl,this_00,false);
      impl_local._4_4_ = this_00->id;
      IStack_10 = Converter::Impl::get_id_for_value(impl,stride,0);
      ret.chain_id = 0x10;
      spv::Builder::addCapability(this,CapabilityInt8);
    }
    else {
      buffer_1._4088_8_ = get_thread_log_callback();
      if ((LoggingCallback)buffer_1._4088_8_ == (LoggingCallback)0x0) {
        fprintf(_stderr,"[ERROR]: Expected BDA or SSBO for WMMA load-store.\n");
        fflush(_stderr);
      }
      else {
        snprintf(local_2078,0x1000,"Expected BDA or SSBO for WMMA load-store.\n");
        uVar2 = buffer_1._4088_8_;
        pvVar6 = get_thread_log_callback_userdata();
        (*(code *)uVar2)(pvVar6,2,local_2078);
      }
    }
  }
  WVar1.stride_id = IStack_10;
  WVar1.chain_id = impl_local._4_4_;
  WVar1.alignment = ret.chain_id;
  return WVar1;
}

Assistant:

static WMMAAccessChain build_wmma_access_chain(
	Converter::Impl &impl, const llvm::Value *offset, const llvm::Value *stride)
{
	WMMAAccessChain ret = {};
	auto &builder = impl.builder();

	if (impl.ags.active_uav_op == DXIL::Op::AtomicBinOp)
	{
		// LDS access chains are in terms of u32 elements for whatever reason ...
		// This is convenient for us however, since SPIR-V is defined the same way.
		// TODO: Unsure what happens if the LDS pointer is u16, but FSR4 doesn't use that, so whatever.
		auto *chain = impl.allocate(spv::OpAccessChain,
		                            builder.makePointer(spv::StorageClassWorkgroup, builder.makeUintType(32)));
		chain->add_id(impl.ags.active_uav_ptr);
		chain->add_id(impl.get_id_for_value(offset));

		impl.add(chain);
		ret.chain_id = chain->id;
		ret.stride_id = impl.get_id_for_value(stride);
		return ret;
	}

	// Build the actual load.
	const auto &meta = impl.handle_to_resource_meta[impl.ags.active_uav_ptr];

	if (meta.storage == spv::StorageClassStorageBuffer || impl.ags.active_uav_op == DXIL::Op::AtomicBinOp)
	{
		spv::Id buffer_id = get_buffer_alias_handle(
			impl, meta, impl.ags.active_uav_ptr, RawType::Integer, RawWidth::B8, RawVecSize::V1);

		if (!buffer_id)
		{
			LOGE("Failed to get buffer alias.\n");
			return ret;
		}

		// Cooperative matrix is in terms of elements of the value type, not bytes.
		// We could use 8-bit storage, but that means adding a lot of extra cruft ...
		auto *chain = impl.allocate(spv::OpAccessChain,
		                            builder.makePointer(spv::StorageClassStorageBuffer, builder.makeUintType(8)));
		chain->add_id(buffer_id);
		chain->add_id(builder.makeUintConstant(0));
		chain->add_id(impl.get_id_for_value(offset));

		impl.add(chain);
		ret.chain_id = chain->id;
		ret.stride_id = impl.get_id_for_value(stride);
	}
	else if (meta.storage == spv::StorageClassPhysicalStorageBuffer)
	{
		if (!impl.ags.u8_array_bda_type)
		{
			impl.ags.u8_array_bda_type = builder.makeRuntimeArray(builder.makeUintType(8));
			builder.addDecoration(impl.ags.u8_array_bda_type, spv::DecorationArrayStride, 1);
		}

		auto *cast = impl.allocate(spv::OpBitcast,
		                           builder.makePointer(spv::StorageClassPhysicalStorageBuffer, impl.ags.u8_array_bda_type));

		cast->add_id(impl.ags.active_uav_ptr);
		impl.add(cast);

		auto *chain = impl.allocate(spv::OpAccessChain,
		                            builder.makePointer(spv::StorageClassPhysicalStorageBuffer, builder.makeUintType(8)));
		chain->add_id(cast->id);
		chain->add_id(impl.get_id_for_value(offset));
		impl.add(chain);

		ret.chain_id = chain->id;
		ret.stride_id = impl.get_id_for_value(stride);
		ret.alignment = 16; // Unsure what requirements are here. Just do the simple thing.

		builder.addCapability(spv::CapabilityInt8);
	}
	else
	{
		LOGE("Expected BDA or SSBO for WMMA load-store.\n");
	}

	return ret;
}